

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

void HistogramAdd(VP8LHistogram *h1,VP8LHistogram *h2,VP8LHistogram *hout)

{
  long lVar1;
  uint16_t uVar2;
  size_t __n;
  ulong uVar3;
  uint32_t *__src;
  uint32_t *unaff_R12;
  int unaff_R13D;
  bool bVar4;
  uint32_t *local_a0;
  uint32_t *local_98;
  
  uVar3 = 0;
  do {
    switch(uVar3 & 0xffffffff) {
    case 0:
      local_a0 = h1->literal;
      unaff_R13D = (1 << ((byte)h1->palette_code_bits & 0x1f)) + 0x118;
      if (h1->palette_code_bits < 1) {
        unaff_R13D = 0x118;
      }
      break;
    case 1:
      local_a0 = h1->red;
      unaff_R13D = 0x100;
      break;
    case 2:
      local_a0 = h1->blue;
      unaff_R13D = 0x100;
      break;
    case 3:
      local_a0 = h1->alpha;
      unaff_R13D = 0x100;
      break;
    case 4:
      local_a0 = h1->distance;
      unaff_R13D = 0x28;
    }
    switch(uVar3 & 0xffffffff) {
    case 0:
      local_98 = h2->literal;
      unaff_R13D = (1 << ((byte)h2->palette_code_bits & 0x1f)) + 0x118;
      if (h2->palette_code_bits < 1) {
        unaff_R13D = 0x118;
      }
      break;
    case 1:
      local_98 = h2->red;
      unaff_R13D = 0x100;
      break;
    case 2:
      local_98 = h2->blue;
      unaff_R13D = 0x100;
      break;
    case 3:
      local_98 = h2->alpha;
      unaff_R13D = 0x100;
      break;
    case 4:
      local_98 = h2->distance;
      unaff_R13D = 0x28;
    }
    switch(uVar3 & 0xffffffff) {
    case 0:
      unaff_R12 = hout->literal;
      unaff_R13D = (1 << ((byte)hout->palette_code_bits & 0x1f)) + 0x118;
      if (hout->palette_code_bits < 1) {
        unaff_R13D = 0x118;
      }
      break;
    case 1:
      unaff_R12 = hout->red;
      unaff_R13D = 0x100;
      break;
    case 2:
      unaff_R12 = hout->blue;
      unaff_R13D = 0x100;
      break;
    case 3:
      unaff_R12 = hout->alpha;
      unaff_R13D = 0x100;
      break;
    case 4:
      unaff_R12 = hout->distance;
      unaff_R13D = 0x28;
    }
    if (h2 == hout) {
      if (h1->is_used[uVar3] != '\0') {
        if (hout->is_used[uVar3] == '\0') goto LAB_00148e87;
        (*VP8LAddVectorEq)(local_a0,unaff_R12,unaff_R13D);
      }
    }
    else if (h1->is_used[uVar3] == '\0') {
      __n = (long)unaff_R13D << 2;
      __src = local_98;
      if (h2->is_used[uVar3] != '\0') goto LAB_00148e96;
      memset(unaff_R12,0,__n);
    }
    else if (h2->is_used[uVar3] == '\0') {
LAB_00148e87:
      __n = (long)unaff_R13D << 2;
      __src = local_a0;
LAB_00148e96:
      memcpy(unaff_R12,__src,__n);
    }
    else {
      (*VP8LAddVector)(local_a0,local_98,unaff_R12,unaff_R13D);
    }
    uVar3 = uVar3 + 1;
    if (uVar3 == 5) {
      lVar1 = 0;
      do {
        uVar2 = h1->trivial_symbol[lVar1];
        if (uVar2 != h2->trivial_symbol[lVar1]) {
          uVar2 = 0xffff;
        }
        hout->trivial_symbol[lVar1] = uVar2;
        bVar4 = true;
        if (h1->is_used[lVar1] == '\0') {
          bVar4 = h2->is_used[lVar1] != '\0';
        }
        hout->is_used[lVar1] = bVar4;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 5);
      return;
    }
  } while( true );
}

Assistant:

static WEBP_INLINE void HistogramAdd(const VP8LHistogram* const h1,
                                     const VP8LHistogram* const h2,
                                     VP8LHistogram* const hout) {
  int i;
  assert(h1->palette_code_bits == h2->palette_code_bits);

  for (i = 0; i < 5; ++i) {
    int length;
    const uint32_t *p1, *p2, *pout_const;
    uint32_t* pout;
    GetPopulationInfo(h1, (HistogramIndex)i, &p1, &length);
    GetPopulationInfo(h2, (HistogramIndex)i, &p2, &length);
    GetPopulationInfo(hout, (HistogramIndex)i, &pout_const, &length);
    pout = (uint32_t*)pout_const;
    if (h2 == hout) {
      if (h1->is_used[i]) {
        if (hout->is_used[i]) {
          VP8LAddVectorEq(p1, pout, length);
        } else {
          memcpy(pout, p1, length * sizeof(pout[0]));
        }
      }
    } else {
      if (h1->is_used[i]) {
        if (h2->is_used[i]) {
          VP8LAddVector(p1, p2, pout, length);
        } else {
          memcpy(pout, p1, length * sizeof(pout[0]));
        }
      } else if (h2->is_used[i]) {
        memcpy(pout, p2, length * sizeof(pout[0]));
      } else {
        memset(pout, 0, length * sizeof(pout[0]));
      }
    }
  }

  for (i = 0; i < 5; ++i) {
    hout->trivial_symbol[i] = h1->trivial_symbol[i] == h2->trivial_symbol[i]
                                  ? h1->trivial_symbol[i]
                                  : VP8L_NON_TRIVIAL_SYM;
    hout->is_used[i] = h1->is_used[i] || h2->is_used[i];
  }
}